

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O3

double __thiscall
chrono::ChFunction::Compute_mean
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  int iVar1;
  double mx;
  double dVar2;
  double dVar3;
  
  if (xmax < xmin) {
    return NAN;
  }
  dVar3 = 0.0;
  iVar1 = 0;
  do {
    iVar1 = iVar1 + 1;
    dVar2 = xmin;
    (*this->_vptr_ChFunction[10])(this,derivate);
    dVar3 = dVar3 + dVar2;
    xmin = xmin + sampling_step;
  } while (xmin <= xmax);
  return dVar3 / (double)iVar1;
}

Assistant:

double ChFunction::Compute_mean(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = 0;
    int numpts = 0;
    for (double mx = xmin; mx <= xmax; mx = mx + sampling_step) {
        numpts++;
        mret += this->Get_y_dN(mx, derivate);
    }
    return mret / ((double)numpts);
}